

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iraffits.c
# Opt level: O2

int fits_delete_iraf_file(char *filename,int *status)

{
  int iVar1;
  char *irafheader;
  char *pixname;
  char *pcVar2;
  char *pcVar3;
  int nc;
  int lenirafhead;
  char pixfilename [256];
  
  irafheader = irafrdhead(filename,&lenirafhead);
  if (irafheader == (char *)0x0) {
    *status = 0x68;
    return 0x68;
  }
  iVar1 = head_version(irafheader);
  if (iVar1 == 2) {
    pixname = irafgetc(irafheader,0x7e,0xff);
  }
  else {
    if (iVar1 == 0) {
      ffpmsg("File not valid IRAF image header");
      ffpmsg(filename);
      *status = 0x68;
      iVar1 = 0x68;
      goto LAB_001ca5c7;
    }
    pixname = irafgetc2(irafheader,0x19c,nc);
  }
  if ((((*pixname == 'H') && (pixname[1] == 'D')) && (pixname[2] == 'R')) &&
     (pcVar2 = same_path(pixname,filename), pcVar2 != (char *)0x0)) {
    free(pixname);
    pixname = pcVar2;
  }
  pcVar2 = strchr(pixname,0x2f);
  if (((pcVar2 == (char *)0x0) && (pcVar2 = strchr(pixname,0x24), pcVar2 == (char *)0x0)) &&
     (pcVar2 = same_path(pixname,filename), pcVar2 != (char *)0x0)) {
    free(pixname);
    pixname = pcVar2;
  }
  pcVar3 = strchr(pixname,0x21);
  pcVar2 = pcVar3 + 1;
  if (pcVar3 == (char *)0x0) {
    pcVar2 = pixname;
  }
  strcpy(pixfilename,pcVar2);
  free(pixname);
  iVar1 = *status;
LAB_001ca5c7:
  free(irafheader);
  if (iVar1 < 1) {
    remove(filename);
    remove(pixfilename);
    iVar1 = *status;
  }
  return iVar1;
}

Assistant:

int fits_delete_iraf_file(const char *filename,  /* name of input file      */
             int *status)                        /* IO - error status       */

/*
   Delete the iraf .imh header file and the associated .pix data file
*/
{
    char *irafheader;
    int lenirafhead;

    char pixfilename[SZ_IM2PIXFILE+1];

    /* read IRAF header into dynamically created char array (free it later!) */
    irafheader = irafrdhead(filename, &lenirafhead);

    if (!irafheader)
    {
	return(*status = FILE_NOT_OPENED);
    }

    getirafpixname (filename, irafheader, pixfilename, status);

    /* don't need the IRAF header any more */
    free(irafheader);

    if (*status > 0)
       return(*status);

    remove(filename);
    remove(pixfilename);
    
    return(*status);
}